

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

RegExp * re2c::repeat_from_to(RegExp *e,uint32_t n,uint32_t m)

{
  RegExp *pRVar1;
  RegExp *e1;
  RegExp *pRVar2;
  
  pRVar1 = repeat(e,n);
  pRVar2 = (RegExp *)0x0;
  for (; n < m; n = n + 1) {
    e1 = (RegExp *)operator_new(8);
    NullOp::NullOp((NullOp *)e1);
    pRVar2 = doCat(e,pRVar2);
    pRVar2 = mkAlt(e1,pRVar2);
  }
  pRVar1 = doCat(pRVar1,pRVar2);
  return pRVar1;
}

Assistant:

RegExp * repeat_from_to (RegExp * e, uint32_t n, uint32_t m)
{
	RegExp * r1 = repeat (e, n);
	RegExp * r2 = NULL;
	for (uint32_t i = n; i < m; ++i)
	{
		r2 = mkAlt (new NullOp, doCat (e, r2));
	}
	return doCat (r1, r2);
}